

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarmath_p.h
# Opt level: O2

R_conflict18 QRomanCalendrical::yearMonthToYearDays(int year,int month)

{
  int iVar1;
  R_conflict18 RVar2;
  
  iVar1 = month + 9;
  if (2 < month) {
    iVar1 = month + -3;
  }
  RVar2.days = (ulong)(iVar1 * 0x99 + 2) / 5;
  RVar2.year = (long)(int)((year - (year >> 0x1f)) - (uint)(month < 3));
  return RVar2;
}

Assistant:

constexpr auto yearMonthToYearDays(int year, int month)
{
    // Pre-digests year and month to (possibly denormal) year count and day-within-year.
    struct R { qint64 year; qint64 days; };
    if (year < 0) // Represent -N BCE as 1-N so year numbering is contiguous.
        ++year;
    month -= 3; // Adjust month numbering so March = 0, ...
    if (month < 0) { // and Jan = 10, Feb = 11, in the previous year.
        --year;
        month += 12;
    }
    return R { year, QRoundingDown::qDiv<5>(FiveMonths * month + 2) };
}